

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O1

int __thiscall TokenPipeEnd::TokenRead(TokenPipeEnd *this)

{
  ssize_t sVar1;
  int *piVar2;
  uint unaff_EBP;
  long in_FS_OFFSET;
  bool bVar3;
  uint8_t token;
  byte local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    sVar1 = read(this->m_fd,&local_29,1);
    if (sVar1 < 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
      if (!bVar3) {
        unaff_EBP = 0xffffffff;
      }
    }
    else {
      if (sVar1 == 0) {
        unaff_EBP = 0xfffffffe;
      }
      else {
        unaff_EBP = (uint)local_29;
      }
      bVar3 = false;
    }
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return unaff_EBP;
}

Assistant:

int TokenPipeEnd::TokenRead()
{
    uint8_t token;
    while (true) {
        ssize_t result = read(m_fd, &token, 1);
        if (result < 0) {
            // Failure. Check if the read was interrupted by a signal,
            // in that case retry.
            if (errno != EINTR) {
                return TS_ERR;
            }
        } else if (result == 0) {
            return TS_EOS;
        } else { // ==1
            return token;
        }
    }
    return token;
}